

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O3

LispPTR N_OP_makenumber(LispPTR tosm1,LispPTR tos)

{
  uint *puVar1;
  uint uVar2;
  LispPTR LVar3;
  
  if ((tos & 0xffff0000) == 0xe0000 && (tosm1 & 0xffff0000) == 0xe0000) {
    if (tosm1 << 0x10 == 0xffff0000) {
      LVar3 = tos | 0xf0000;
    }
    else {
      uVar2 = tos & 0xffff | tosm1 << 0x10;
      if ((tosm1 & 0xffff) == 0) {
        LVar3 = uVar2 | 0xe0000;
      }
      else {
        puVar1 = (uint *)createcell68k(2);
        *puVar1 = uVar2;
        if (((ulong)puVar1 & 1) != 0) {
          printf("Misaligned pointer in LAddrFromNative %p\n",puVar1);
        }
        LVar3 = (LispPTR)((ulong)((long)puVar1 - (long)Lisp_world) >> 1);
      }
    }
  }
  else {
    MachineState.errorexit = 1;
    LVar3 = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  return LVar3;
}

Assistant:

LispPTR N_OP_makenumber(LispPTR tosm1, LispPTR tos) {
  int result;

  if (((tosm1 & 0xFFFF0000) != S_POSITIVE) || ((tos & 0xFFFF0000) != S_POSITIVE)) ERROR_EXIT(tos);
  /* UB: left shift of 49152 by 16 places cannot be represented in type 'int' */
  result = (int)(((tosm1 & 0xffff) << 16) | (tos & 0xffff));
  N_ARITH_SWITCH(result);
}